

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

void __thiscall FNodeBuilder::CreateSubsectorsForReal(FNodeBuilder *this)

{
  uint *puVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  USegPtr *pUVar4;
  subsector_t *psVar5;
  uint uVar6;
  seg_t *psVar7;
  seg_t *psVar8;
  ulong uVar9;
  uint uVar10;
  
  if ((this->SubsectorSets).Count != 0) {
    uVar9 = 0;
    do {
      uVar3 = (this->SegList).Count;
      psVar8 = (seg_t *)(ulong)uVar3;
      uVar6 = (this->SubsectorSets).Array[uVar9];
      uVar10 = uVar3;
      while (uVar6 != 0xffffffff) {
        pFVar2 = (this->Segs).Array + uVar6;
        TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Grow(&this->SegList,1);
        (this->SegList).Array[(this->SegList).Count].SegPtr = pFVar2;
        uVar10 = (this->SegList).Count + 1;
        (this->SegList).Count = uVar10;
        uVar6 = pFVar2->next;
      }
      qsort((this->SegList).Array + (long)psVar8,(ulong)(uVar10 - uVar3),8,SortSegs);
      psVar7 = psVar8;
      if (uVar3 < (this->SegList).Count) {
        do {
          pUVar4 = (this->SegList).Array;
          pUVar4[(long)psVar7].SegNum =
               (int)((ulong)((long)pUVar4[(long)psVar7].SegPtr - (long)(this->Segs).Array) >> 3) *
               0x38e38e39;
          psVar7 = (seg_t *)((long)&psVar7->v1 + 1);
        } while (psVar7 < (seg_t *)(ulong)(this->SegList).Count);
      }
      TArray<subsector_t,_subsector_t>::Grow(&this->Subsectors,1);
      psVar5 = (this->Subsectors).Array;
      uVar6 = (this->Subsectors).Count;
      psVar5[uVar6].BSP = (FMiniBSP *)0x0;
      psVar5[uVar6].sector = (sector_t *)0x0;
      psVar5[uVar6].polys = (FPolyNode *)0x0;
      psVar5[uVar6].firstline = psVar8;
      psVar5[uVar6].render_sector = (sector_t *)0x0;
      psVar5[uVar6].numlines = uVar10 - uVar3;
      psVar5[uVar6].flags = 0;
      puVar1 = &(this->Subsectors).Count;
      *puVar1 = *puVar1 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->SubsectorSets).Count);
  }
  return;
}

Assistant:

void FNodeBuilder::CreateSubsectorsForReal ()
{
	subsector_t sub;
	unsigned int i;

	sub.sector = NULL;
	sub.polys = NULL;
	sub.BSP = NULL;
	sub.flags = 0;
	sub.render_sector = NULL;

	for (i = 0; i < SubsectorSets.Size(); ++i)
	{
		DWORD set = SubsectorSets[i];
		DWORD firstline = (DWORD)SegList.Size();

		while (set != DWORD_MAX)
		{
			USegPtr ptr;

			ptr.SegPtr = &Segs[set];
			SegList.Push (ptr);
			set = ptr.SegPtr->next;
		}
		sub.numlines = (DWORD)(SegList.Size() - firstline);
		sub.firstline = (seg_t *)(size_t)firstline;

		// Sort segs by linedef for special effects
		qsort (&SegList[firstline], sub.numlines, sizeof(USegPtr), SortSegs);

		// Convert seg pointers into indices
		D(Printf (PRINT_LOG, "Output subsector %d:\n", Subsectors.Size()));
		for (unsigned int i = firstline; i < SegList.Size(); ++i)
		{
			D(Printf (PRINT_LOG, "  Seg %5d%c%d(%5d,%5d)-%d(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", SegList[i].SegPtr - &Segs[0],
				SegList[i].SegPtr->linedef == -1 ? '+' : ' ',
				SegList[i].SegPtr->v1,
				Vertices[SegList[i].SegPtr->v1].x>>16,
				Vertices[SegList[i].SegPtr->v1].y>>16,
				SegList[i].SegPtr->v2,
				Vertices[SegList[i].SegPtr->v2].x>>16,
				Vertices[SegList[i].SegPtr->v2].y>>16,
				Vertices[SegList[i].SegPtr->v1].x, Vertices[SegList[i].SegPtr->v1].y,
				Vertices[SegList[i].SegPtr->v2].x, Vertices[SegList[i].SegPtr->v2].y));
			SegList[i].SegNum = DWORD(SegList[i].SegPtr - &Segs[0]);
		}
		Subsectors.Push (sub);
	}
}